

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsFrame.cpp
# Opt level: O3

void __thiscall KDReports::Frame::build(Frame *this,ReportBuilder *builder)

{
  double dVar1;
  FramePrivate *pFVar2;
  long lVar3;
  ElementData *pEVar4;
  long lVar5;
  int iVar6;
  qreal qVar7;
  QTextFrameFormat format;
  QTextCursor contentsCursor;
  ReportBuilder contentsBuilder;
  QTextFrameFormat aQStack_d8 [16];
  QTextCursor local_c8 [8];
  QColor local_c0;
  ReportBuilder local_b0;
  QTextCursor *local_38;
  
  QTextFrameFormat::QTextFrameFormat(aQStack_d8);
  pFVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
           .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl;
  dVar1 = pFVar2->m_width;
  iVar6 = (int)aQStack_d8;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    if (pFVar2->m_widthUnit == Millimeters) {
      qVar7 = mmToPixels(dVar1);
      local_c0.cspec = Rgb;
      local_c0.ct._4_6_ = SUB86(qVar7,0);
      local_c0._14_2_ = SUB82((ulong)qVar7 >> 0x30,0);
      QTextLength::operator_cast_to_QVariant((QVariant *)&local_b0,(QTextLength *)&local_c0);
      QTextFormat::setProperty(iVar6,(QVariant *)0x4003);
    }
    else {
      local_c0.cspec = Hsv;
      local_c0.ct._4_6_ = SUB86(dVar1,0);
      local_c0._14_2_ = SUB82((ulong)dVar1 >> 0x30,0);
      QTextLength::operator_cast_to_QVariant((QVariant *)&local_b0,(QTextLength *)&local_c0);
      QTextFormat::setProperty(iVar6,(QVariant *)0x4003);
    }
    QVariant::~QVariant((QVariant *)&local_b0);
  }
  pFVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
           .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl;
  dVar1 = pFVar2->m_height;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    if (pFVar2->m_heightUnit == Millimeters) {
      qVar7 = mmToPixels(dVar1);
      local_c0.cspec = Rgb;
      local_c0.ct._4_6_ = SUB86(qVar7,0);
      local_c0._14_2_ = SUB82((ulong)qVar7 >> 0x30,0);
      QTextLength::operator_cast_to_QVariant((QVariant *)&local_b0,(QTextLength *)&local_c0);
      QTextFormat::setProperty(iVar6,(QVariant *)0x4004);
    }
    else {
      local_c0.cspec = Hsv;
      local_c0.ct._4_6_ = SUB86(dVar1,0);
      local_c0._14_2_ = SUB82((ulong)dVar1 >> 0x30,0);
      QTextLength::operator_cast_to_QVariant((QVariant *)&local_b0,(QTextLength *)&local_c0);
      QTextFormat::setProperty(iVar6,(QVariant *)0x4004);
    }
    QVariant::~QVariant((QVariant *)&local_b0);
  }
  qVar7 = mmToPixels(((this->d)._M_t.
                      super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
                      .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl)->
                     m_padding);
  QVariant::QVariant((QVariant *)&local_b0,qVar7);
  QTextFormat::setProperty(iVar6,(QVariant *)0x4002);
  QVariant::~QVariant((QVariant *)&local_b0);
  QVariant::QVariant((QVariant *)&local_b0,
                     ((this->d)._M_t.
                      super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
                      .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl)->
                     m_border);
  QTextFormat::setProperty(iVar6,(QVariant *)0x4000);
  QVariant::~QVariant((QVariant *)&local_b0);
  QVariant::QVariant((QVariant *)&local_b0,
                     ((this->d)._M_t.
                      super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
                      .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl)->
                     m_position);
  QTextFormat::setProperty(iVar6,(QVariant *)0x800);
  QVariant::~QVariant((QVariant *)&local_b0);
  TextDocumentData::aboutToModifyContents(builder->m_contentDocument,Append);
  QTextCursor::insertFrame((QTextFrameFormat *)&builder->m_cursor);
  QTextFrame::firstCursorPosition();
  local_38 = &builder->m_cursor;
  ReportBuilder::ReportBuilder(&local_b0,builder->m_contentDocument,local_c8,builder->m_report);
  ReportBuilder::copyStateFrom(&local_b0,builder);
  pFVar2 = (this->d)._M_t.
           super___uniq_ptr_impl<KDReports::FramePrivate,_std::default_delete<KDReports::FramePrivate>_>
           ._M_t.
           super__Tuple_impl<0UL,_KDReports::FramePrivate_*,_std::default_delete<KDReports::FramePrivate>_>
           .super__Head_base<0UL,_KDReports::FramePrivate_*,_false>._M_head_impl;
  lVar3 = *(qsizetype *)((long)&(pFVar2->m_elements).d + 0x10);
  if (lVar3 != 0) {
    pEVar4 = *(ElementData **)((long)&(pFVar2->m_elements).d + 8);
    lVar5 = 0;
    do {
      switch((&pEVar4->field_0x8)[lVar5] & 7) {
      case 0:
        ReportBuilder::addInlineElement(&local_b0,*(Element **)((long)&pEVar4->m_element + lVar5));
        break;
      case 1:
        local_c0.cspec = Invalid;
        local_c0.ct.argb.alpha = 0xffff;
        local_c0.ct.argb.red = 0;
        local_c0.ct._4_6_ = 0;
        ReportBuilder::addBlockElement
                  (&local_b0,*(Element **)((long)&pEVar4->m_element + lVar5),
                   *(AlignmentFlag *)((long)&pEVar4->field_2 + lVar5),&local_c0);
        break;
      case 2:
        ReportBuilder::addVariable(&local_b0,*(VariableType *)((long)&pEVar4->field_2 + lVar5));
        break;
      case 3:
        ReportBuilder::addVerticalSpacing(&local_b0,*(qreal *)((long)&pEVar4->field_2 + lVar5));
      }
      lVar5 = lVar5 + 0x18;
    } while (lVar3 * 0x18 != lVar5);
  }
  QTextCursor::movePosition((MoveOperation)local_38,0xb,0);
  ReportBuilder::~ReportBuilder(&local_b0);
  QTextCursor::~QTextCursor(local_c8);
  QTextFormat::~QTextFormat((QTextFormat *)aQStack_d8);
  return;
}

Assistant:

void KDReports::Frame::build(ReportBuilder &builder) const
{
    // prepare the frame
    QTextFrameFormat format;
    if (d->m_width) {
        if (d->m_widthUnit == Millimeters) {
            format.setWidth(QTextLength(QTextLength::FixedLength, mmToPixels(d->m_width)));
        } else {
            format.setWidth(QTextLength(QTextLength::PercentageLength, d->m_width));
        }
    }
    if (d->m_height) {
        if (d->m_heightUnit == Millimeters) {
            format.setHeight(QTextLength(QTextLength::FixedLength, mmToPixels(d->m_height)));
        } else {
            format.setHeight(QTextLength(QTextLength::PercentageLength, d->m_height));
        }
    }

    format.setPadding(mmToPixels(padding()));
    format.setBorder(d->m_border);
    // TODO borderBrush like in AbstractTableElement
    format.setPosition(static_cast<QTextFrameFormat::Position>(d->m_position)); // those enums have the same value

    QTextCursor &textDocCursor = builder.cursor();

    QTextFrame *frame = textDocCursor.insertFrame(format);

    QTextCursor contentsCursor = frame->firstCursorPosition();

    ReportBuilder contentsBuilder(builder.currentDocumentData(), contentsCursor, builder.report());
    contentsBuilder.copyStateFrom(builder);

    for (const KDReports::ElementData &ed : std::as_const(d->m_elements)) {
        switch (ed.m_type) {
        case KDReports::ElementData::Inline:
            contentsBuilder.addInlineElement(*ed.m_element);
            break;
        case KDReports::ElementData::Block:
            contentsBuilder.addBlockElement(*ed.m_element, ed.m_align);
            break;
        case KDReports::ElementData::Variable:
            contentsBuilder.addVariable(ed.m_variableType);
            break;
        case KDReports::ElementData::VerticalSpacing:
            contentsBuilder.addVerticalSpacing(ed.m_value);
            break;
        }
    }

    textDocCursor.movePosition(QTextCursor::End);
}